

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

Image * GetClipboardImage(void)

{
  Image *in_RDI;
  
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  TraceLog(4,
           "Clipboard image: PLATFORM_DESKTOP_GLFW doesn\'t implement `GetClipboardImage` for this OS"
          );
  TraceLog(4,"Clipboard image: Couldn\'t get clipboard data.");
  return in_RDI;
}

Assistant:

Image GetClipboardImage(void)
{
    Image image = {0};
    unsigned long long int dataSize = 0;
    void* fileData = NULL;

#ifdef _WIN32
    int width, height;
    fileData  = (void*)Win32GetClipboardImageData(&width, &height, &dataSize);
#else
    TRACELOG(LOG_WARNING, "Clipboard image: PLATFORM_DESKTOP_GLFW doesn't implement `GetClipboardImage` for this OS");
#endif

    if (fileData == NULL)
    {
        TRACELOG(LOG_WARNING, "Clipboard image: Couldn't get clipboard data.");
    }
    else
    {
        image = LoadImageFromMemory(".bmp", fileData, (int)dataSize);
    }
    return image;
}